

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_rank_function.cpp
# Opt level: O2

void __thiscall
duckdb::WindowRankExecutor::EvaluateInternal
          (WindowRankExecutor *this,WindowExecutorGlobalState *gstate,
          WindowExecutorLocalState *lstate,DataChunk *eval_chunk,Vector *result,idx_t count,
          idx_t row_idx)

{
  WindowExecutorLocalState *this_00;
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  long *plVar4;
  long *plVar5;
  reference pvVar6;
  pointer this_01;
  idx_t iVar7;
  idx_t i;
  idx_t iVar8;
  idx_t i_1;
  
  pdVar1 = result->data;
  this_00 = lstate + 2;
  if (gstate[1].super_WindowExecutorState._vptr_WindowExecutorState == (_func_int **)0x0) {
    pvVar6 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)this_00,0);
    plVar4 = (long *)pvVar6->data;
    pvVar6 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)this_00,2);
    plVar5 = (long *)pvVar6->data;
    lstate[0x12].range_cursor.
    super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
    super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>.
    super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl =
         (WindowCursor *)((*plVar5 - *plVar4) + 1);
    lstate[0x12].super_WindowExecutorState._vptr_WindowExecutorState =
         (_func_int **)(row_idx - *plVar5);
    for (iVar8 = 0; count != iVar8; iVar8 = iVar8 + 1) {
      WindowPeerLocalState::NextRank
                ((WindowPeerLocalState *)lstate,plVar4[iVar8],plVar5[iVar8],iVar8 + row_idx);
      *(WindowCursor **)(pdVar1 + iVar8 * 8) =
           lstate[0x12].range_cursor.
           super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
           super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>
           .super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl;
    }
  }
  else {
    pvVar6 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)this_00,6);
    pdVar2 = pvVar6->data;
    pvVar6 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)this_00,7);
    pdVar3 = pvVar6->data;
    for (iVar8 = 0; count != iVar8; iVar8 = iVar8 + 1) {
      this_01 = unique_ptr<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>,_true>
                ::operator->((unique_ptr<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>,_true>
                              *)(gstate + 1));
      iVar7 = WindowTokenTree::Rank
                        (this_01,*(idx_t *)(pdVar2 + iVar8 * 8),*(idx_t *)(pdVar3 + iVar8 * 8),
                         row_idx + iVar8);
      *(idx_t *)(pdVar1 + iVar8 * 8) = iVar7;
    }
  }
  return;
}

Assistant:

void WindowRankExecutor::EvaluateInternal(WindowExecutorGlobalState &gstate, WindowExecutorLocalState &lstate,
                                          DataChunk &eval_chunk, Vector &result, idx_t count, idx_t row_idx) const {
	auto &gpeer = gstate.Cast<WindowPeerGlobalState>();
	auto &lpeer = lstate.Cast<WindowPeerLocalState>();
	auto rdata = FlatVector::GetData<uint64_t>(result);

	if (gpeer.token_tree) {
		auto frame_begin = FlatVector::GetData<const idx_t>(lpeer.bounds.data[FRAME_BEGIN]);
		auto frame_end = FlatVector::GetData<const idx_t>(lpeer.bounds.data[FRAME_END]);
		for (idx_t i = 0; i < count; ++i, ++row_idx) {
			rdata[i] = gpeer.token_tree->Rank(frame_begin[i], frame_end[i], row_idx);
		}
		return;
	}

	//	Reset to "previous" row
	auto partition_begin = FlatVector::GetData<const idx_t>(lpeer.bounds.data[PARTITION_BEGIN]);
	auto peer_begin = FlatVector::GetData<const idx_t>(lpeer.bounds.data[PEER_BEGIN]);
	lpeer.rank = (peer_begin[0] - partition_begin[0]) + 1;
	lpeer.rank_equal = (row_idx - peer_begin[0]);

	for (idx_t i = 0; i < count; ++i, ++row_idx) {
		lpeer.NextRank(partition_begin[i], peer_begin[i], row_idx);
		rdata[i] = lpeer.rank;
	}
}